

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qitemselectionmodel.cpp
# Opt level: O2

void QItemSelectionModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QArrayDataPointer<QModelIndex> *this;
  bool bVar2;
  int iVar3;
  Data *pDVar4;
  undefined8 *puVar5;
  InterfaceType *pIVar6;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  QModelIndex *parent;
  ulong uVar7;
  QModelIndex *parent_00;
  QModelIndex *parent_01;
  QModelIndex *parent_02;
  undefined4 in_register_00000034;
  void *pvVar8;
  long in_FS_OFFSET;
  Data *local_38;
  QModelIndex *pQStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_18;
  
  parent = (QModelIndex *)&local_38;
  parent_00 = (QModelIndex *)&local_38;
  parent_01 = (QModelIndex *)&local_38;
  parent_02 = (QModelIndex *)&local_38;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        selectionChanged((QItemSelectionModel *)_o,(QItemSelection *)_a[1],(QItemSelection *)_a[2]);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        currentChanged((QItemSelectionModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        currentRowChanged((QItemSelectionModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        currentColumnChanged((QItemSelectionModel *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        modelChanged((QItemSelectionModel *)_o,*_a[1]);
        return;
      }
      break;
    case 5:
      pvVar8 = _a[1];
      uVar7 = (ulong)*_a[2];
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0xc];
      goto LAB_00405fcf;
    case 6:
      pvVar8 = _a[1];
      uVar7 = (ulong)*_a[2];
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0xd];
      goto LAB_00405fcf;
    case 7:
      pvVar8 = _a[1];
      uVar7 = (ulong)*_a[2];
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0xe];
LAB_00405fcf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (*UNRECOVERED_JUMPTABLE_00)(_o,pvVar8,uVar7,UNRECOVERED_JUMPTABLE_00);
        return;
      }
      break;
    case 8:
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0xf];
      goto LAB_0040603a;
    case 9:
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x10];
      goto LAB_0040603a;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clearSelection((QItemSelectionModel *)_o);
        return;
      }
      break;
    case 0xb:
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x11];
LAB_0040603a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (*UNRECOVERED_JUMPTABLE_00)
                  (_o,CONCAT44(in_register_00000034,_c),*(long *)(in_FS_OFFSET + 0x28),
                   UNRECOVERED_JUMPTABLE_00);
        return;
      }
      break;
    case 0xc:
      bVar2 = isSelected((QItemSelectionModel *)_o,(QModelIndex *)_a[1]);
      goto LAB_00406093;
    case 0xd:
      parent_00 = (QModelIndex *)_a[2];
      iVar3 = *_a[1];
      goto LAB_00405fb1;
    case 0xe:
      iVar3 = *_a[1];
      local_38 = (Data *)0xffffffffffffffff;
      pQStack_30 = (QModelIndex *)0x0;
      local_28.ptr = (QAbstractItemModel *)0x0;
LAB_00405fb1:
      bVar2 = isRowSelected((QItemSelectionModel *)_o,iVar3,parent_00);
LAB_00406093:
      if (*_a != (void *)0x0) {
        *(bool *)*_a = bVar2;
      }
      goto switchD_00405b79_default;
    case 0xf:
      parent = (QModelIndex *)_a[2];
      iVar3 = *_a[1];
      goto LAB_00405eca;
    case 0x10:
      iVar3 = *_a[1];
      local_38 = (Data *)0xffffffffffffffff;
      pQStack_30 = (QModelIndex *)0x0;
      local_28.ptr = (QAbstractItemModel *)0x0;
LAB_00405eca:
      bVar2 = isColumnSelected((QItemSelectionModel *)_o,iVar3,parent);
      goto LAB_00406093;
    case 0x11:
      parent_01 = (QModelIndex *)_a[2];
      iVar3 = *_a[1];
      goto LAB_00406003;
    case 0x12:
      iVar3 = *_a[1];
      local_38 = (Data *)0xffffffffffffffff;
      pQStack_30 = (QModelIndex *)0x0;
      local_28.ptr = (QAbstractItemModel *)0x0;
LAB_00406003:
      bVar2 = rowIntersectsSelection((QItemSelectionModel *)_o,iVar3,parent_01);
      goto LAB_00406093;
    case 0x13:
      parent_02 = (QModelIndex *)_a[2];
      iVar3 = *_a[1];
      goto LAB_0040608b;
    case 0x14:
      iVar3 = *_a[1];
      local_38 = (Data *)0xffffffffffffffff;
      pQStack_30 = (QModelIndex *)0x0;
      local_28.ptr = (QAbstractItemModel *)0x0;
LAB_0040608b:
      bVar2 = columnIntersectsSelection((QItemSelectionModel *)_o,iVar3,parent_02);
      goto LAB_00406093;
    case 0x15:
      iVar3 = *_a[1];
      goto LAB_0040607a;
    case 0x16:
      iVar3 = 0;
LAB_0040607a:
      local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_30 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      selectedRows((QModelIndexList *)&local_38,(QItemSelectionModel *)_o,iVar3);
LAB_004060c8:
      if ((QArrayDataPointer<QModelIndex> *)*_a != (QArrayDataPointer<QModelIndex> *)0x0) {
        QArrayDataPointer<QModelIndex>::operator=
                  ((QArrayDataPointer<QModelIndex> *)*_a,(QArrayDataPointer<QModelIndex> *)&local_38
                  );
      }
LAB_004060db:
      QArrayDataPointer<QModelIndex>::~QArrayDataPointer
                ((QArrayDataPointer<QModelIndex> *)&local_38);
      goto switchD_00405b79_default;
    case 0x17:
      iVar3 = *_a[1];
      goto LAB_004060c3;
    case 0x18:
      iVar3 = 0;
LAB_004060c3:
      local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_30 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      selectedColumns((QModelIndexList *)&local_38,(QItemSelectionModel *)_o,iVar3);
      goto LAB_004060c8;
    default:
      goto switchD_00405b79_default;
    }
    goto LAB_004060f8;
  case ReadProperty:
    if (4 < (uint)_id) break;
    this = (QArrayDataPointer<QModelIndex> *)*_a;
    switch(_id) {
    case 0:
      pDVar4 = (Data *)model((QItemSelectionModel *)_o);
      this->d = pDVar4;
      break;
    case 1:
      bVar2 = hasSelection((QItemSelectionModel *)_o);
      *(bool *)&this->d = bVar2;
      break;
    case 2:
      currentIndex((QModelIndex *)&local_38,(QItemSelectionModel *)_o);
      this->size = (qsizetype)local_28.ptr;
      this->d = local_38;
      this->ptr = pQStack_30;
      break;
    case 3:
      selection((QItemSelection *)&local_38,(QItemSelectionModel *)_o);
      QArrayDataPointer<QItemSelectionRange>::operator=
                ((QArrayDataPointer<QItemSelectionRange> *)this,
                 (QArrayDataPointer<QItemSelectionRange> *)&local_38);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                ((QArrayDataPointer<QItemSelectionRange> *)&local_38);
      break;
    case 4:
      selectedIndexes((QModelIndexList *)&local_38,(QItemSelectionModel *)_o);
      QArrayDataPointer<QModelIndex>::operator=(this,(QArrayDataPointer<QModelIndex> *)&local_38);
      goto LAB_004060db;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setModel((QItemSelectionModel *)_o,**_a);
        return;
      }
      goto LAB_004060f8;
    }
    break;
  default:
    if (_c == BindableProperty && _id == 0) {
      plVar1 = (long *)*_a;
      *plVar1 = (long)&(_o->d_ptr).d[1].children.d.size;
      plVar1[1] = (long)&QtPrivate::
                         QBindableInterfaceForProperty<QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>,_void>
                         ::iface;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::
            indexOfMethod<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&)>
                      ((QtMocHelpers *)_a,(void **)selectionChanged,0,0);
    if ((((!bVar2) &&
         (bVar2 = QtMocHelpers::
                  indexOfMethod<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&)>
                            ((QtMocHelpers *)_a,(void **)currentChanged,0,1), !bVar2)) &&
        (bVar2 = QtMocHelpers::
                 indexOfMethod<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&)>
                           ((QtMocHelpers *)_a,(void **)currentRowChanged,0,2), !bVar2)) &&
       (bVar2 = QtMocHelpers::
                indexOfMethod<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&)>
                          ((QtMocHelpers *)_a,(void **)currentColumnChanged,0,3), !bVar2)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QItemSelectionModel::*)(QAbstractItemModel*)>
                  ((QtMocHelpers *)_a,(void **)modelChanged,0,4);
        return;
      }
      goto LAB_004060f8;
    }
    break;
  case RegisterPropertyMetaType:
    if (_id == 0) {
      iVar3 = qMetaTypeId<QAbstractItemModel*>();
    }
    else if (_id == 3) {
      iVar3 = qMetaTypeId<QItemSelection>();
    }
    else {
      if (_id != 4) {
        *(undefined4 *)*_a = 0xffffffff;
        break;
      }
      iVar3 = qMetaTypeId<QList<QModelIndex>>();
    }
    *(int *)*_a = iVar3;
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 0) {
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] < 2) {
LAB_00405d31:
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType;
LAB_00405d38:
        *puVar5 = pIVar6;
        break;
      }
    }
    else if (_id == 4) {
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
        goto LAB_00405d38;
      }
    }
    else if (_id == 7) {
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) goto LAB_00405d31;
    }
    else {
      puVar5 = (undefined8 *)*_a;
    }
    *puVar5 = 0;
  }
switchD_00405b79_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_004060f8:
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QItemSelectionModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectionChanged((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[2]))); break;
        case 1: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 2: _t->currentRowChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 3: _t->currentColumnChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 4: _t->modelChanged((*reinterpret_cast< std::add_pointer_t<QAbstractItemModel*>>(_a[1]))); break;
        case 5: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 6: _t->select((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 7: _t->select((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 8: _t->clear(); break;
        case 9: _t->reset(); break;
        case 10: _t->clearSelection(); break;
        case 11: _t->clearCurrentIndex(); break;
        case 12: { bool _r = _t->isSelected((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 13: { bool _r = _t->isRowSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 14: { bool _r = _t->isRowSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 15: { bool _r = _t->isColumnSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 16: { bool _r = _t->isColumnSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 17: { bool _r = _t->rowIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 18: { bool _r = _t->rowIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 19: { bool _r = _t->columnIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 20: { bool _r = _t->columnIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 21: { QModelIndexList _r = _t->selectedRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 22: { QModelIndexList _r = _t->selectedRows();
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 23: { QModelIndexList _r = _t->selectedColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 24: { QModelIndexList _r = _t->selectedColumns();
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractItemModel* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QItemSelection & , const QItemSelection & )>(_a, &QItemSelectionModel::selectionChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentRowChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentColumnChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(QAbstractItemModel * )>(_a, &QItemSelectionModel::modelChanged, 4))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractItemModel* >(); break;
        case 3:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QItemSelection >(); break;
        case 4:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QModelIndexList >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QAbstractItemModel**>(_v) = _t->model(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->hasSelection(); break;
        case 2: *reinterpret_cast<QModelIndex*>(_v) = _t->currentIndex(); break;
        case 3: *reinterpret_cast<QItemSelection*>(_v) = _t->selection(); break;
        case 4: *reinterpret_cast<QModelIndexList*>(_v) = _t->selectedIndexes(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setModel(*reinterpret_cast<QAbstractItemModel**>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableModel(); break;
        default: break;
        }
    }
}